

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O0

void __thiscall
QNetworkAccessManagerPrivate::ensureBackendPluginsLoaded(QNetworkAccessManagerPrivate *this)

{
  long lVar1;
  Type *pTVar2;
  long lVar3;
  unique_lock<QBasicMutex> *in_RDI;
  long in_FS_OFFSET;
  int index;
  unique_lock<QBasicMutex> locker;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::unique_lock<QBasicMutex>::unique_lock
            (in_RDI,(mutex_type *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  pTVar2 = QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>_>
           ::operator()((QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>_>
                         *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (pTVar2 != (Type *)0x0) {
    QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>_>::
    operator->((QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>_>
                *)0x19b34c);
    QFactoryLoader::update();
    do {
      pTVar2 = QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>_>
               ::operator->((QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qnabfLoader>_>
                             *)0x19b367);
      lVar3 = QFactoryLoader::instance((int)pTVar2);
    } while (lVar3 != 0);
  }
  std::unique_lock<QBasicMutex>::~unique_lock(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkAccessManagerPrivate::ensureBackendPluginsLoaded()
{
    Q_CONSTINIT static QBasicMutex mutex;
    std::unique_lock locker(mutex);
    if (!qnabfLoader())
        return;
#if QT_CONFIG(library)
    qnabfLoader->update();
#endif
    int index = 0;
    while (qnabfLoader->instance(index))
        ++index;
}